

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,do_statement *s)

{
  pointer pbVar1;
  bool bVar2;
  label_set ls;
  label_set local_c8;
  value *local_a8;
  wstring_view *local_a0;
  completion local_98;
  value local_58;
  
  local_c8.
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((do_statement *)this->labels_valid_for_ == s) {
    local_c8.
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->label_set_).
         super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_c8.
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->label_set_).
         super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_c8.
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->label_set_).
         super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->label_set_).
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->label_set_).
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->label_set_).
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pbVar1 = (this->label_set_).
             super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->label_set_).
        super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
      (this->label_set_).
      super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
    }
  }
  this->labels_valid_for_ = (statement *)0x0;
  completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
  local_a8 = &__return_storage_ptr__->result;
  local_a0 = &__return_storage_ptr__->target;
  do {
    eval(&local_98,this,
         (s->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
         _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
         super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl);
    __return_storage_ptr__->type = local_98.type;
    value::operator=(local_a8,&local_98.result);
    local_a0->_M_len = local_98.target._M_len;
    local_a0->_M_str = local_98.target._M_str;
    value::destroy(&local_98.result);
    bVar2 = handle_completion(__return_storage_ptr__,&local_c8);
    if (bVar2) goto LAB_0012fd6b;
    eval(&local_58,this,
         (s->cond_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value((value *)&local_98,this,&local_58);
    bVar2 = to_boolean((value *)&local_98);
    value::destroy((value *)&local_98);
    value::destroy(&local_58);
  } while (bVar2);
  if (__return_storage_ptr__->type != normal) {
    __assert_fail("!c",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x3aa,"completion mjs::interpreter::impl::operator()(const do_statement &)");
  }
LAB_0012fd6b:
  if (local_c8.
      super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const do_statement& s) {
        const auto ls = get_labels(s);
        completion c{};
        do {
            c = eval(s.s());
            if (handle_completion(c, ls)) {
                return c;
            }
        } while (to_boolean(get_value(eval(s.cond()))));
        assert(!c);
        return c;//completion{c.result};
    }